

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O2

void duckdb::
     LeastGreatestFunction<duckdb::hugeint_t,duckdb::GreaterThan,duckdb::StandardLeastGreatest<false>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  data_ptr_t pdVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  long lVar4;
  reference pvVar5;
  long *plVar6;
  pointer pVVar7;
  VectorType vector_type_p;
  ulong uVar8;
  ulong uVar9;
  idx_t col_idx;
  ulong uVar10;
  pointer pVVar11;
  UnifiedVectorFormat vdata;
  bool result_has_value [2048];
  
  pVVar7 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar11 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((long)pVVar11 - (long)pVVar7 == 0x68) {
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
    Vector::Reference(result,pvVar5);
    return;
  }
  vector_type_p = CONSTANT_VECTOR;
  for (uVar10 = 0; uVar10 < (ulong)(((long)pVVar11 - (long)pVVar7) / 0x68); uVar10 = uVar10 + 1) {
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar10);
    if (pvVar5->vector_type != CONSTANT_VECTOR) {
      vector_type_p = FLAT_VECTOR;
    }
    pVVar7 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar11 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  pdVar1 = result->data;
  uVar10 = 0;
  switchD_014c69ad::default(result_has_value,0,0x800);
  do {
    if ((ulong)(((long)pVVar11 - (long)pVVar7) / 0x68) <= uVar10) {
      StandardLeastGreatest<false>::FinalizeResult(args->count,result_has_value,result,state);
      Vector::SetVectorType(result,vector_type_p);
      return;
    }
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar10);
    if (pvVar5->vector_type == CONSTANT_VECTOR) {
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar10);
      puVar2 = (pvVar5->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) goto LAB_01cfda1e;
    }
    else {
LAB_01cfda1e:
      UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar10);
      Vector::ToUnifiedFormat(pvVar5,args->count,&vdata);
      if (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        plVar6 = (long *)(pdVar1 + 8);
        for (uVar8 = 0; uVar8 < args->count; uVar8 = uVar8 + 1) {
          uVar9 = uVar8;
          if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar9 = (ulong)(vdata.sel)->sel_vector[uVar8];
          }
          uVar3 = *(ulong *)(vdata.data + uVar9 * 0x10);
          lVar4 = *(long *)(vdata.data + uVar9 * 0x10 + 8);
          if (result_has_value[uVar8] == true) {
            if ((*plVar6 < lVar4) || ((ulong)plVar6[-1] < uVar3 && lVar4 == *plVar6))
            goto LAB_01cfdb16;
          }
          else {
LAB_01cfdb16:
            result_has_value[uVar8] = true;
            plVar6[-1] = uVar3;
            *plVar6 = lVar4;
          }
          plVar6 = plVar6 + 2;
        }
      }
      else {
        plVar6 = (long *)(pdVar1 + 8);
        for (uVar8 = 0; uVar8 < args->count; uVar8 = uVar8 + 1) {
          uVar9 = uVar8;
          if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar9 = (ulong)(vdata.sel)->sel_vector[uVar8];
          }
          if ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar9 >> 6]
               >> (uVar9 & 0x3f) & 1) != 0) {
            uVar3 = *(ulong *)(vdata.data + uVar9 * 0x10);
            lVar4 = *(long *)(vdata.data + uVar9 * 0x10 + 8);
            if (result_has_value[uVar8] == true) {
              if ((lVar4 <= *plVar6) && (uVar3 <= (ulong)plVar6[-1] || lVar4 != *plVar6))
              goto LAB_01cfdac1;
            }
            result_has_value[uVar8] = true;
            plVar6[-1] = uVar3;
            *plVar6 = lVar4;
          }
LAB_01cfdac1:
          plVar6 = plVar6 + 2;
        }
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
    }
    uVar10 = uVar10 + 1;
    pVVar7 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar11 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}